

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O0

char * google::protobuf::compiler::java::FieldTypeName(Type field_type)

{
  LogMessage *other;
  LogFinisher local_5d [13];
  LogMessage local_50;
  Type local_14;
  char *pcStack_10;
  Type field_type_local;
  
  switch(field_type) {
  case TYPE_DOUBLE:
    pcStack_10 = "DOUBLE";
    break;
  case TYPE_FLOAT:
    pcStack_10 = "FLOAT";
    break;
  case TYPE_INT64:
    pcStack_10 = "INT64";
    break;
  case TYPE_UINT64:
    pcStack_10 = "UINT64";
    break;
  case TYPE_INT32:
    pcStack_10 = "INT32";
    break;
  case TYPE_FIXED64:
    pcStack_10 = "FIXED64";
    break;
  case TYPE_FIXED32:
    pcStack_10 = "FIXED32";
    break;
  case TYPE_BOOL:
    pcStack_10 = "BOOL";
    break;
  case TYPE_STRING:
    pcStack_10 = "STRING";
    break;
  case TYPE_GROUP:
    pcStack_10 = "GROUP";
    break;
  case TYPE_MESSAGE:
    pcStack_10 = "MESSAGE";
    break;
  case TYPE_BYTES:
    pcStack_10 = "BYTES";
    break;
  case TYPE_UINT32:
    pcStack_10 = "UINT32";
    break;
  case TYPE_ENUM:
    pcStack_10 = "ENUM";
    break;
  case TYPE_SFIXED32:
    pcStack_10 = "SFIXED32";
    break;
  case TYPE_SFIXED64:
    pcStack_10 = "SFIXED64";
    break;
  case TYPE_SINT32:
    pcStack_10 = "SINT32";
    break;
  case MAX_TYPE:
    pcStack_10 = "SINT64";
    break;
  default:
    local_14 = field_type;
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_helpers.cc"
               ,0x22d);
    other = internal::LogMessage::operator<<(&local_50,"Can\'t get here.");
    internal::LogFinisher::operator=(local_5d,other);
    internal::LogMessage::~LogMessage(&local_50);
    pcStack_10 = (char *)0x0;
  }
  return pcStack_10;
}

Assistant:

const char* FieldTypeName(FieldDescriptor::Type field_type) {
  switch (field_type) {
    case FieldDescriptor::TYPE_INT32:
      return "INT32";
    case FieldDescriptor::TYPE_UINT32:
      return "UINT32";
    case FieldDescriptor::TYPE_SINT32:
      return "SINT32";
    case FieldDescriptor::TYPE_FIXED32:
      return "FIXED32";
    case FieldDescriptor::TYPE_SFIXED32:
      return "SFIXED32";
    case FieldDescriptor::TYPE_INT64:
      return "INT64";
    case FieldDescriptor::TYPE_UINT64:
      return "UINT64";
    case FieldDescriptor::TYPE_SINT64:
      return "SINT64";
    case FieldDescriptor::TYPE_FIXED64:
      return "FIXED64";
    case FieldDescriptor::TYPE_SFIXED64:
      return "SFIXED64";
    case FieldDescriptor::TYPE_FLOAT:
      return "FLOAT";
    case FieldDescriptor::TYPE_DOUBLE:
      return "DOUBLE";
    case FieldDescriptor::TYPE_BOOL:
      return "BOOL";
    case FieldDescriptor::TYPE_STRING:
      return "STRING";
    case FieldDescriptor::TYPE_BYTES:
      return "BYTES";
    case FieldDescriptor::TYPE_ENUM:
      return "ENUM";
    case FieldDescriptor::TYPE_GROUP:
      return "GROUP";
    case FieldDescriptor::TYPE_MESSAGE:
      return "MESSAGE";

      // No default because we want the compiler to complain if any new
      // types are added.
  }

  GOOGLE_LOG(FATAL) << "Can't get here.";
  return NULL;
}